

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Matmul_patch(char transa,char transb,void *alpha,void *beta,int g_a,int *alo,int *ahi,
                     int g_b,int *blo,int *bhi,int g_c,int *clo,int *chi)

{
  long g_a_00;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int in_stack_00000028;
  long in_stack_00000030;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer cndim;
  Integer c;
  Integer bndim;
  Integer b;
  Integer andim;
  Integer a;
  int local_210;
  int local_20c;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  long local_1b8;
  Integer *in_stack_fffffffffffffe50;
  Integer in_stack_fffffffffffffe58;
  Integer *in_stack_fffffffffffffe60;
  Integer *in_stack_fffffffffffffe68;
  Integer in_stack_fffffffffffffe70;
  Integer *in_stack_fffffffffffffe78;
  Integer *in_stack_fffffffffffffe80;
  long local_178 [8];
  long local_138 [8];
  long local_f8 [8];
  long local_b8 [8];
  Integer local_78;
  long local_70;
  Integer local_68;
  long local_60;
  Integer local_58;
  
  g_a_00 = (long)in_R8D;
  local_58 = pnga_ndim(g_a_00);
  local_60 = (long)in_stack_00000010;
  local_68 = pnga_ndim(g_a_00);
  local_70 = (long)in_stack_00000028;
  local_78 = pnga_ndim(g_a_00);
  for (iVar4 = 0; iVar4 < local_58; iVar4 = iVar4 + 1) {
    local_b8[(local_58 - iVar4) + -1] = (long)*(int *)(in_R9 + (long)iVar4 * 4) + 1;
  }
  for (iVar3 = 0; iVar3 < local_58; iVar3 = iVar3 + 1) {
    local_f8[(local_58 - iVar3) + -1] = (long)*(int *)(in_stack_00000008 + (long)iVar3 * 4) + 1;
  }
  for (iVar2 = 0; iVar2 < local_68; iVar2 = iVar2 + 1) {
    local_138[(local_68 - iVar2) + -1] = (long)*(int *)(in_stack_00000018 + (long)iVar2 * 4) + 1;
  }
  for (iVar1 = 0; iVar1 < local_68; iVar1 = iVar1 + 1) {
    local_178[(local_68 - iVar1) + -1] = (long)*(int *)(in_stack_00000020 + (long)iVar1 * 4) + 1;
  }
  for (local_20c = 0; local_20c < local_78; local_20c = local_20c + 1) {
    (&local_1b8)[(local_78 - local_20c) + -1] =
         (long)*(int *)(in_stack_00000030 + (long)local_20c * 4) + 1;
  }
  for (local_210 = 0; local_210 < local_78; local_210 = local_210 + 1) {
    *(long *)(&stack0xfffffffffffffe08 + ((local_78 - local_210) + -1) * 8) =
         (long)*(int *)(_i_5 + (long)local_210 * 4) + 1;
  }
  pnga_matmul_patch(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08,CONCAT44(iVar4,iVar3),(Integer *)CONCAT44(iVar2,iVar1)
                    ,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                    in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                    in_stack_fffffffffffffe80);
  return;
}

Assistant:

void NGA_Matmul_patch(char transa, char transb, void* alpha, void *beta,
		      int g_a, int alo[], int ahi[], 
		      int g_b, int blo[], int bhi[], 
		      int g_c, int clo[], int chi[]) 

{
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);
    
    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    
    Integer c=(Integer)g_c;
    Integer cndim = wnga_ndim(c);
    
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    
    wnga_matmul_patch(&transb, &transa, alpha, beta,
		     b, _ga_blo, _ga_bhi,
		     a, _ga_alo, _ga_ahi,
		     c, _ga_clo, _ga_chi);
}